

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O0

int Mop_ManRemoveIdentical(Mop_Man_t *p,Vec_Int_t *vGroup)

{
  int iVar1;
  int iVar2;
  int iVar3;
  word *__s1;
  word *pwVar4;
  word *pwVar5;
  word *pCube2;
  word *pCube2Out;
  word *pCube1;
  word *pCube1Out;
  int nEqual;
  int iCube2;
  int iCube1;
  int c2;
  int c1;
  int w;
  Vec_Int_t *vGroup_local;
  Mop_Man_t *p_local;
  
  pCube1Out._0_4_ = 0;
  for (iCube1 = 0; iVar1 = Vec_IntSize(vGroup), iCube1 < iVar1; iCube1 = iCube1 + 1) {
    iVar1 = Vec_IntEntry(vGroup,iCube1);
    if (iVar1 != -1) {
      __s1 = Mop_ManCubeIn(p,iVar1);
      iCube2 = iCube1;
      while( true ) {
        iCube2 = iCube2 + 1;
        iVar2 = Vec_IntSize(vGroup);
        if (iVar2 <= iCube2) break;
        iVar2 = Vec_IntEntry(vGroup,iCube2);
        if (iVar2 != -1) {
          pwVar4 = Mop_ManCubeIn(p,iVar2);
          iVar3 = memcmp(__s1,pwVar4,(long)p->nWordsIn << 3);
          if (iVar3 == 0) {
            pwVar4 = Mop_ManCubeOut(p,iVar1);
            pwVar5 = Mop_ManCubeOut(p,iVar2);
            for (c2 = 0; c2 < p->nWordsOut; c2 = c2 + 1) {
              pwVar4[c2] = pwVar5[c2] | pwVar4[c2];
            }
            Vec_IntWriteEntry(vGroup,iCube2,-1);
            Vec_IntPush(p->vFree,iVar2);
            pCube1Out._0_4_ = (int)pCube1Out + 1;
          }
        }
      }
    }
  }
  if ((int)pCube1Out != 0) {
    Map_ManGroupCompact(vGroup);
  }
  return (int)pCube1Out;
}

Assistant:

int Mop_ManRemoveIdentical( Mop_Man_t * p, Vec_Int_t * vGroup )
{
    int w, c1, c2, iCube1, iCube2, nEqual = 0;
    Vec_IntForEachEntry( vGroup, iCube1, c1 )
    if ( iCube1 != -1 )
    {
        word * pCube1Out, * pCube1 = Mop_ManCubeIn( p, iCube1 );
        Vec_IntForEachEntryStart( vGroup, iCube2, c2, c1+1 )
        if ( iCube2 != -1 )
        {
            word * pCube2Out, * pCube2 = Mop_ManCubeIn( p, iCube2 );
            if ( memcmp(pCube1, pCube2, sizeof(word)*p->nWordsIn) )
                continue;
            // merge cubes
            pCube1Out = Mop_ManCubeOut( p, iCube1 );
            pCube2Out = Mop_ManCubeOut( p, iCube2 );
            for ( w = 0; w < p->nWordsOut; w++ )
                pCube1Out[w] |= pCube2Out[w];
            Vec_IntWriteEntry( vGroup, c2, -1 );
            Vec_IntPush( p->vFree, iCube2 );
            nEqual++;
        }
    }
    if ( nEqual )
        Map_ManGroupCompact( vGroup );
    return nEqual;
}